

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Netlist.h
# Opt level: O1

NetlistVariableDeclaration * __thiscall
netlist::Netlist::addVariableDeclaration(Netlist *this,Symbol *symbol)

{
  _Head_base<0UL,_netlist::NetlistNode_*,_false> _Var1;
  string_view hierarchicalPath;
  string hierPath;
  __uniq_ptr_impl<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_> local_40;
  string local_38;
  
  slang::ast::Symbol::getHierarchicalPath_abi_cxx11_(&local_38,symbol);
  hierarchicalPath._M_str = local_38._M_dataplus._M_p;
  hierarchicalPath._M_len = local_38._M_string_length;
  _Var1._M_head_impl = &lookupVariable(this,hierarchicalPath)->super_NetlistNode;
  if ((NetlistVariableDeclaration *)_Var1._M_head_impl == (NetlistVariableDeclaration *)0x0) {
    _Var1._M_head_impl = (NetlistNode *)operator_new(0x78);
    (((NetlistNode *)&(_Var1._M_head_impl)->super_Node<netlist::NetlistNode,_netlist::NetlistEdge>)
    ->super_Node<netlist::NetlistNode,_netlist::NetlistEdge>).edges.
    super__Vector_base<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>,_std::allocator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (((NetlistNode *)&(_Var1._M_head_impl)->super_Node<netlist::NetlistNode,_netlist::NetlistEdge>)
    ->super_Node<netlist::NetlistNode,_netlist::NetlistEdge>).edges.
    super__Vector_base<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>,_std::allocator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (((NetlistNode *)&(_Var1._M_head_impl)->super_Node<netlist::NetlistNode,_netlist::NetlistEdge>)
    ->super_Node<netlist::NetlistNode,_netlist::NetlistEdge>).edges.
    super__Vector_base<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>,_std::allocator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (((NetlistNode *)&(_Var1._M_head_impl)->super_Node<netlist::NetlistNode,_netlist::NetlistEdge>)
    ->super_Node<netlist::NetlistNode,_netlist::NetlistEdge>)._vptr_Node =
         (_func_int **)&PTR__Node_005d11b8;
    NetlistNode::nextID = NetlistNode::nextID + 1;
    (_Var1._M_head_impl)->ID = NetlistNode::nextID;
    (_Var1._M_head_impl)->kind = VariableDeclaration;
    (_Var1._M_head_impl)->symbol = symbol;
    (_Var1._M_head_impl)->edgeKind = None;
    (_Var1._M_head_impl)->blocked = false;
    (((NetlistNode *)&(_Var1._M_head_impl)->super_Node<netlist::NetlistNode,_netlist::NetlistEdge>)
    ->super_Node<netlist::NetlistNode,_netlist::NetlistEdge>)._vptr_Node =
         (_func_int **)&PTR__NetlistVariableDeclaration_005d1158;
    _Var1._M_head_impl[1].super_Node<netlist::NetlistNode,_netlist::NetlistEdge>._vptr_Node =
         (_func_int **)
         &_Var1._M_head_impl[1].super_Node<netlist::NetlistNode,_netlist::NetlistEdge>.edges.
          super__Vector_base<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>,_std::allocator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    _Var1._M_head_impl[1].super_Node<netlist::NetlistNode,_netlist::NetlistEdge>.edges.
    super__Vector_base<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>,_std::allocator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&_Var1._M_head_impl[1].super_Node<netlist::NetlistNode,_netlist::NetlistEdge>.edges.
         super__Vector_base<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>,_std::allocator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->_M_local_buf[0] = '\0';
    (((vector<netlist::NetlistVariableAlias_*,_std::allocator<netlist::NetlistVariableAlias_*>_> *)
     &_Var1._M_head_impl[1].ID)->
    super__Vector_base<netlist::NetlistVariableAlias_*,_std::allocator<netlist::NetlistVariableAlias_*>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)&_Var1._M_head_impl[1].kind = (pointer)0x0;
    _Var1._M_head_impl[1].symbol = (Symbol *)0x0;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (_Var1._M_head_impl + 1),&local_38);
    local_40._M_t.
    super__Tuple_impl<0UL,_netlist::NetlistNode_*,_std::default_delete<netlist::NetlistNode>_>.
    super__Head_base<0UL,_netlist::NetlistNode_*,_false>._M_head_impl =
         (tuple<netlist::NetlistNode_*,_std::default_delete<netlist::NetlistNode>_>)
         (tuple<netlist::NetlistNode_*,_std::default_delete<netlist::NetlistNode>_>)
         _Var1._M_head_impl;
    std::
    vector<std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>,std::allocator<std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>>>
    ::emplace_back<std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>>
              ((vector<std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>,std::allocator<std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>>>
                *)&(this->super_DirectedGraph<netlist::NetlistNode,_netlist::NetlistEdge>).nodes,
               (unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_> *)
               &local_40);
    if ((_Tuple_impl<0UL,_netlist::NetlistNode_*,_std::default_delete<netlist::NetlistNode>_>)
        local_40._M_t.
        super__Tuple_impl<0UL,_netlist::NetlistNode_*,_std::default_delete<netlist::NetlistNode>_>.
        super__Head_base<0UL,_netlist::NetlistNode_*,_false>._M_head_impl != (NetlistNode *)0x0) {
      (**(code **)(*(long *)local_40._M_t.
                            super__Tuple_impl<0UL,_netlist::NetlistNode_*,_std::default_delete<netlist::NetlistNode>_>
                            .super__Head_base<0UL,_netlist::NetlistNode_*,_false>._M_head_impl + 8))
                ();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return (NetlistVariableDeclaration *)_Var1._M_head_impl;
}

Assistant:

NetlistVariableDeclaration& addVariableDeclaration(const ast::Symbol& symbol) {
        std::string hierPath = symbol.getHierarchicalPath();
        if (auto* result = lookupVariable(hierPath)) {
            DEBUG_PRINT("Variable declaration for {} already exists", hierPath);
            return *result;
        }
        else {
            auto nodePtr = std::make_unique<NetlistVariableDeclaration>(symbol);
            nodePtr->hierarchicalPath = hierPath;
            auto& node = nodePtr->as<NetlistVariableDeclaration>();
            nodes.push_back(std::move(nodePtr));
            DEBUG_PRINT("Add var decl {}\n", node.hierarchicalPath);
            return node;
        }
    }